

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_static.c
# Opt level: O1

uchar * rans_uncompress_O0(uchar *in,uint in_size,uint *out_size)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  uchar *puVar8;
  long lVar9;
  void *__ptr;
  uchar *puVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint *puVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint *puVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  RansDecSymbol syms [256];
  ari_decoder D;
  uint local_c68;
  ushort auStack_c38 [512];
  uint local_838 [512];
  void *local_38;
  
  memset(local_838,0,0x808);
  if (*in != '\0') {
    return (uchar *)0x0;
  }
  if (*(int *)(in + 1) != in_size - 9) {
    return (uchar *)0x0;
  }
  bVar2 = in[5];
  uVar16 = (long)(int)((uint)in[8] << 0x18 | (uint)in[7] << 0x10 | (uint)in[6] << 8) | (ulong)bVar2;
  puVar8 = (uchar *)malloc(uVar16);
  uVar12 = 0;
  if (puVar8 == (uchar *)0x0) {
    return (uchar *)0x0;
  }
  uVar13 = (uint)in[9];
  puVar18 = (uint *)(in + 10);
  uVar19 = 0;
  __ptr = local_38;
  do {
    bVar3 = (byte)*puVar18;
    lVar9 = (long)(int)uVar13;
    local_838[lVar9 * 2] = (uint)bVar3;
    if ((char)bVar3 < '\0') {
      uVar11 = bVar3 & 0x7f;
      local_838[lVar9 * 2] = uVar11;
      pbVar1 = (byte *)((long)puVar18 + 1);
      puVar18 = (uint *)((long)puVar18 + 2);
      local_838[lVar9 * 2] = (uint)*pbVar1 | uVar11 << 8;
    }
    else {
      puVar18 = (uint *)((long)puVar18 + 1);
    }
    local_838[lVar9 * 2 + 1] = uVar19;
    if (0x10000 < uVar19) {
      __assert_fail("start <= (1 << 16)",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                    ,0x103,"void RansDecSymbolInit(RansDecSymbol *, uint32_t, uint32_t)");
    }
    uVar11 = local_838[lVar9 * 2];
    if (0x10000 - uVar19 < uVar11) {
      __assert_fail("freq <= (1 << 16) - start",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                    ,0x104,"void RansDecSymbolInit(RansDecSymbol *, uint32_t, uint32_t)");
    }
    auStack_c38[lVar9 * 2] = (ushort)uVar19;
    auStack_c38[lVar9 * 2 + 1] = (ushort)uVar11;
    if (__ptr == (void *)0x0) {
      __ptr = malloc(0x1000);
      local_38 = __ptr;
    }
    memset((void *)((ulong)uVar19 + (long)__ptr),uVar13,(long)(int)uVar11);
    if (uVar12 == 0) {
      uVar12 = uVar13 + 1;
      uVar13 = (uint)(byte)*puVar18;
      if (uVar12 == uVar13) {
        uVar12 = (uint)*(byte *)((long)puVar18 + 1);
        puVar18 = (uint *)((long)puVar18 + 2);
      }
      else {
        puVar18 = (uint *)((long)puVar18 + 1);
        uVar12 = 0;
      }
    }
    else {
      uVar12 = uVar12 - 1;
      uVar13 = uVar13 + 1;
    }
    uVar19 = uVar11 + uVar19;
  } while (uVar13 != 0);
  if (0xfff < (int)uVar19) {
    __assert_fail("x < TOTFREQ",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_static.c"
                  ,0x102,
                  "unsigned char *rans_uncompress_O0(unsigned char *, unsigned int, unsigned int *)"
                 );
  }
  uVar12 = *puVar18;
  uVar13 = puVar18[1];
  uVar19 = puVar18[2];
  puVar14 = puVar18 + 4;
  local_c68 = (uint)uVar16;
  uVar16 = (long)(int)local_c68 & 0xfffffffffffffffc;
  uVar11 = (uint)uVar16;
  if (0 < (int)uVar11) {
    uVar20 = puVar18[3];
    uVar17 = 0;
    do {
      bVar3 = *(byte *)((long)__ptr + (ulong)(uVar12 & 0xfff));
      bVar4 = *(byte *)((long)__ptr + (ulong)(uVar13 & 0xfff));
      bVar5 = *(byte *)((long)__ptr + (ulong)(uVar19 & 0xfff));
      uVar7 = auStack_c38[(ulong)bVar3 * 2 + 1];
      bVar6 = *(byte *)((long)__ptr + (ulong)(uVar20 & 0xfff));
      puVar8[uVar17] = bVar3;
      uVar12 = ((uVar12 & 0xfff) - (uint)auStack_c38[(ulong)bVar3 * 2]) +
               (uVar12 >> 0xc) * (uint)uVar7;
      puVar8[uVar17 + 1] = bVar4;
      puVar8[uVar17 + 2] = bVar5;
      puVar8[uVar17 + 3] = bVar6;
      uVar15 = uVar12;
      if (uVar12 < 0x800000) {
        do {
          uVar12 = *puVar14;
          puVar14 = (uint *)((long)puVar14 + 1);
          uVar12 = (uint)(byte)uVar12 | uVar15 << 8;
          bVar21 = uVar15 < 0x8000;
          uVar15 = uVar12;
        } while (bVar21);
      }
      uVar13 = ((uVar13 & 0xfff) - (uint)auStack_c38[(ulong)bVar4 * 2]) +
               (uVar13 >> 0xc) * (uint)auStack_c38[(ulong)bVar4 * 2 + 1];
      uVar15 = uVar13;
      if (uVar13 < 0x800000) {
        do {
          uVar13 = *puVar14;
          puVar14 = (uint *)((long)puVar14 + 1);
          uVar13 = (uint)(byte)uVar13 | uVar15 << 8;
          bVar21 = uVar15 < 0x8000;
          uVar15 = uVar13;
        } while (bVar21);
      }
      uVar19 = ((uVar19 & 0xfff) - (uint)auStack_c38[(ulong)bVar5 * 2]) +
               (uVar19 >> 0xc) * (uint)auStack_c38[(ulong)bVar5 * 2 + 1];
      uVar15 = uVar19;
      if (uVar19 < 0x800000) {
        do {
          uVar19 = *puVar14;
          puVar14 = (uint *)((long)puVar14 + 1);
          uVar19 = (uint)(byte)uVar19 | uVar15 << 8;
          bVar21 = uVar15 < 0x8000;
          uVar15 = uVar19;
        } while (bVar21);
      }
      uVar20 = ((uVar20 & 0xfff) - (uint)auStack_c38[(ulong)bVar6 * 2]) +
               (uVar20 >> 0xc) * (uint)auStack_c38[(ulong)bVar6 * 2 + 1];
      uVar15 = uVar20;
      if (uVar20 < 0x800000) {
        do {
          uVar20 = *puVar14;
          puVar14 = (uint *)((long)puVar14 + 1);
          uVar20 = (uint)(byte)uVar20 | uVar15 << 8;
          bVar21 = uVar15 < 0x8000;
          uVar15 = uVar20;
        } while (bVar21);
      }
      uVar17 = uVar17 + 4;
    } while (uVar17 < ((long)(int)local_c68 & 0xfffffffcU));
  }
  switch(bVar2 & 3) {
  case 0:
    goto switchD_00137589_caseD_0;
  case 1:
    puVar10 = (uchar *)((ulong)(uVar12 & 0xfff) + (long)__ptr);
    break;
  case 2:
    puVar8[uVar16] = *(uchar *)((long)__ptr + (ulong)(uVar12 & 0xfff));
    puVar10 = (uchar *)((ulong)(uVar13 & 0xfff) + (long)__ptr);
    uVar11 = uVar11 | 1;
    break;
  case 3:
    bVar2 = *(byte *)((long)__ptr + (ulong)(uVar12 & 0xfff));
    uVar12 = ((uVar12 & 0xfff) - (uint)auStack_c38[(ulong)bVar2 * 2]) +
             (uVar12 >> 0xc) * (uint)auStack_c38[(ulong)bVar2 * 2 + 1];
    if (uVar12 < 0x800000) {
      do {
        uVar20 = *puVar14;
        puVar14 = (uint *)((long)puVar14 + 1);
        bVar21 = uVar12 < 0x8000;
        uVar12 = (uint)(byte)uVar20 | uVar12 << 8;
      } while (bVar21);
    }
    puVar8[(int)uVar11] = bVar2;
    puVar8[(long)(int)uVar11 + 1] = *(uchar *)((long)__ptr + (ulong)(uVar13 & 0xfff));
    puVar10 = (uchar *)((ulong)(uVar19 & 0xfff) + (long)__ptr);
    uVar11 = uVar11 | 2;
  }
  puVar8[(int)uVar11] = *puVar10;
switchD_00137589_caseD_0:
  *out_size = local_c68;
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return puVar8;
}

Assistant:

unsigned char *rans_uncompress_O0(unsigned char *in, unsigned int in_size,
				  unsigned int *out_size) {
    /* Load in the static tables */
    unsigned char *cp = in + 9;
    int i, j, x, out_sz, in_sz, rle;
    char *out_buf;
    ari_decoder D;
    RansDecSymbol syms[256];

    memset(&D, 0, sizeof(D));

    if (*in++ != 0) // Order-0 check
	return NULL;
    
    in_sz  = ((in[0])<<0) | ((in[1])<<8) | ((in[2])<<16) | ((in[3])<<24);
    out_sz = ((in[4])<<0) | ((in[5])<<8) | ((in[6])<<16) | ((in[7])<<24);
    if (in_sz != in_size-9)
	return NULL;

    out_buf = malloc(out_sz);
    if (!out_buf)
	return NULL;

    //fprintf(stderr, "out_sz=%d\n", out_sz);

    // Precompute reverse lookup of frequency.
    rle = x = 0;
    j = *cp++;
    do {
	if ((D.fc[j].F = *cp++) >= 128) {
	    D.fc[j].F &= ~128;
	    D.fc[j].F = ((D.fc[j].F & 127) << 8) | *cp++;
	}
	D.fc[j].C = x;

	RansDecSymbolInit(&syms[j], D.fc[j].C, D.fc[j].F);

	/* Build reverse lookup table */
	if (!D.R) D.R = (unsigned char *)malloc(TOTFREQ);
	memset(&D.R[x], j, D.fc[j].F);

	x += D.fc[j].F;

	if (!rle && j+1 == *cp) {
	    j = *cp++;
	    rle = *cp++;
	} else if (rle) {
	    rle--;
	    j++;
	} else {
	    j = *cp++;
	}
    } while(j);

    assert(x < TOTFREQ);

    RansState rans0, rans1, rans2, rans3;
    uint8_t *ptr = cp;
    RansDecInit(&rans0, &ptr);
    RansDecInit(&rans1, &ptr);
    RansDecInit(&rans2, &ptr);
    RansDecInit(&rans3, &ptr);

    int out_end = (out_sz&~3);

    RansState R[4];
    R[0] = rans0;
    R[1] = rans1;
    R[2] = rans2;
    R[3] = rans3;
    uint32_t mask = (1u << TF_SHIFT)-1;

    for (i=0; i < out_end; i+=4) {
	uint32_t m[4] = {R[0] & mask,
			 R[1] & mask,
			 R[2] & mask,
			 R[3] & mask};
	uint8_t c[4] = {D.R[m[0]],
			D.R[m[1]],
			D.R[m[2]],
			D.R[m[3]]};
	out_buf[i+0] = c[0];
	out_buf[i+1] = c[1];
	out_buf[i+2] = c[2];
	out_buf[i+3] = c[3];

	// RansDecAdvanceSymbolStep(&R[0], &syms[c[0]], TF_SHIFT);
	// RansDecAdvanceSymbolStep(&R[1], &syms[c[1]], TF_SHIFT);
	// RansDecAdvanceSymbolStep(&R[2], &syms[c[2]], TF_SHIFT);
	// RansDecAdvanceSymbolStep(&R[3], &syms[c[3]], TF_SHIFT);
	R[0] = syms[c[0]].freq * (R[0]>>TF_SHIFT);
	R[1] = syms[c[1]].freq * (R[1]>>TF_SHIFT);
	R[2] = syms[c[2]].freq * (R[2]>>TF_SHIFT);
	R[3] = syms[c[3]].freq * (R[3]>>TF_SHIFT);

	R[0] += m[0] - syms[c[0]].start;
	R[1] += m[1] - syms[c[1]].start;
	R[2] += m[2] - syms[c[2]].start;
	R[3] += m[3] - syms[c[3]].start;

	RansDecRenorm(&R[0], &ptr);
	RansDecRenorm(&R[1], &ptr);
	RansDecRenorm(&R[2], &ptr);
	RansDecRenorm(&R[3], &ptr);
    }

    rans0 = R[0];
    rans1 = R[1];
    rans2 = R[2];
    rans3 = R[3];

    switch(out_sz&3) {
	unsigned char c;
    case 0:
	break;
    case 1:
	c = D.R[RansDecGet(&rans0, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans0, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end] = c;
	break;

    case 2:
	c = D.R[RansDecGet(&rans0, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans0, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end] = c;

	c = D.R[RansDecGet(&rans1, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans1, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end+1] = c;
	break;

    case 3:
	c = D.R[RansDecGet(&rans0, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans0, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end] = c;

	c = D.R[RansDecGet(&rans1, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans1, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end+1] = c;

	c = D.R[RansDecGet(&rans2, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans2, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end+2] = c;
	break;
    }

    *out_size = out_sz;

    if (D.R) free(D.R);

    return (unsigned char *)out_buf;
}